

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_tar_sparse.c
# Opt level: O1

void test_write_format_tar_sparse(void)

{
  undefined1 auVar1 [16];
  archive *a;
  int iVar2;
  mode_t mVar3;
  wchar_t wVar4;
  archive *paVar5;
  time_t tVar6;
  long lVar7;
  char *pcVar8;
  la_ssize_t lVar9;
  la_int64_t lVar10;
  void *__s;
  size_t s;
  ulong uVar11;
  bool bVar12;
  archive_entry *ae;
  size_t used;
  int64_t length;
  int64_t offset;
  char buff3 [1024];
  archive_entry *local_470;
  archive *local_468;
  archive *local_460;
  size_t local_458;
  longlong local_450;
  longlong local_448;
  ulong local_440;
  undefined1 local_438 [1032];
  
  local_468 = (archive *)malloc(0x13000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'+',(uint)(local_468 != (archive *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  uVar11 = 1;
  do {
    paVar5 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'/',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_pax(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'1',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar5);
    iVar2 = archive_write_add_filter_none(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'3',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar5);
    iVar2 = archive_write_set_bytes_per_block(paVar5,(int)uVar11);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'5',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar5);
    iVar2 = archive_write_set_bytes_in_last_block(paVar5,(int)uVar11);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'7',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar5);
    iVar2 = archive_write_get_bytes_in_last_block(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'9',uVar11,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    iVar2 = archive_write_open_memory(paVar5,buff,1000000,&local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar5);
    iVar2 = archive_write_get_bytes_in_last_block(paVar5);
    local_440 = uVar11;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'=',uVar11,"blocksize",(long)iVar2,
                        "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
    local_470 = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'B',(uint)(local_470 != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime(local_470,1,10);
    tVar6 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'D',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
    lVar7 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'E',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    archive_entry_copy_pathname(local_470,"file");
    pcVar8 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'G',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    archive_entry_set_mode(local_470,0x81ed);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'I',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    archive_entry_set_size(local_470,0x81000);
    archive_entry_sparse_add_entry(local_470,0x10000,0x1000);
    archive_entry_sparse_add_entry(local_470,0x80000,0x1000);
    iVar2 = archive_write_header(paVar5,local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar5);
    archive_entry_free(local_470);
    memset(local_468,0x61,0x13000);
    uVar11 = 0;
    do {
      s = 0x81000 - uVar11;
      if (uVar11 < 0x6e001) {
        s = 0x13000;
      }
      lVar9 = archive_write_data(paVar5,local_468,s);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'V',s,"ws",lVar9,"archive_write_data(a, buff2, ws)",(void *)0x0);
      uVar11 = uVar11 + s;
    } while (uVar11 < 0x81000);
    iVar2 = archive_write_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'[',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar5);
    iVar2 = archive_write_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    uVar11 = local_440;
    failure("blocksize=%zu",local_440);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'a',(SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x2bff)) / auVar1,0) + 1) *
                              uVar11,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                        (void *)0x0);
    paVar5 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                     ,L'f',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_format_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'h',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar5
                       );
    iVar2 = archive_read_support_filter_all(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'j',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar5
                       );
    iVar2 = archive_read_open_memory(paVar5,buff,local_458);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'l',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                        paVar5);
    iVar2 = archive_read_next_header(paVar5,&local_470);
    local_460 = paVar5;
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'o',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
    tVar6 = archive_entry_mtime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'q',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
    lVar7 = archive_entry_mtime_nsec(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'r',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar6 = archive_entry_atime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L's',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
    tVar6 = archive_entry_ctime(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L't',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar8 = archive_entry_pathname(local_470);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
               ,L'u',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_filetype(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'v',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                        (void *)0x0);
    mVar3 = archive_entry_mode(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'w',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar10 = archive_entry_size(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'x',0x81000,"0x81000",lVar10,"archive_entry_size(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_reset(local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'z',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'|',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                        (void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'}',0x10000,"0x10000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'~',0x1000,"0x1000",local_450,"length",(void *)0x0);
    wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x80',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)"
                        ,(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x81',0x80000,"0x80000",local_448,"offset",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'\x82',0x1000,"0x1000",local_450,"length",(void *)0x0);
    memset(local_438,0,0x400);
    uVar11 = 0;
    paVar5 = local_468;
    do {
      lVar9 = archive_read_data(local_460,paVar5,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x86',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar11,uVar11 + 0x400);
      paVar5 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x89',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar12 = uVar11 < 0xfc00;
      uVar11 = uVar11 + 0x400;
    } while (bVar12);
    memset(local_438,0x61,0x400);
    uVar11 = 0x10000;
    do {
      lVar9 = archive_read_data(local_460,paVar5,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x8d',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar11,uVar11 + 0x400);
      paVar5 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x90',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar12 = uVar11 < 0x10c00;
      uVar11 = uVar11 + 0x400;
    } while (bVar12);
    memset(local_438,0,0x400);
    uVar11 = 0x11000;
    do {
      lVar9 = archive_read_data(local_460,paVar5,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x94',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all zero",uVar11,uVar11 + 0x400);
      paVar5 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x97',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      bVar12 = uVar11 < 0x7fc00;
      uVar11 = uVar11 + 0x400;
    } while (bVar12);
    memset(local_438,0x61,0x400);
    uVar11 = 0x80000;
    do {
      lVar9 = archive_read_data(local_460,paVar5,0x400);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9b',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",
                          (void *)0x0);
      failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar11,uVar11 + 0x400);
      paVar5 = local_468;
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                          ,L'\x9e',local_468,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
      a = local_460;
      bVar12 = uVar11 < 0x80c00;
      uVar11 = uVar11 + 0x400;
    } while (bVar12);
    iVar2 = archive_read_next_header(local_460,&local_470);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'£',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",a);
    iVar2 = archive_read_close(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¤',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",a);
    iVar2 = archive_read_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'¥',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    uVar11 = local_440 * 2 + 3;
  } while (local_440 < 49999);
  free(local_468);
  __s = malloc(0x11000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'º',(uint)(__s != (void *)0x0),"(buff2 = malloc(buff2_size)) != NULL",
                   (void *)0x0);
  paVar5 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'¼',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_write_set_format_pax(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_pax(a)",paVar5);
  iVar2 = archive_write_add_filter_none(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'À',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar5);
  iVar2 = archive_write_set_bytes_per_block(paVar5,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Â',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_per_block(a, (int)blocksize)",paVar5);
  iVar2 = archive_write_set_bytes_in_last_block(paVar5,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_bytes_in_last_block(a, (int)blocksize)",paVar5);
  iVar2 = archive_write_get_bytes_in_last_block(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Æ',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  iVar2 = archive_write_open_memory(paVar5,buff,1000000,&local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'È',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar5);
  iVar2 = archive_write_get_bytes_in_last_block(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ê',0x2800,"blocksize",(long)iVar2,
                      "archive_write_get_bytes_in_last_block(a)",(void *)0x0);
  local_470 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'Ï',(uint)(local_470 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_470,1,10);
  tVar6 = archive_entry_mtime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ñ',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ò',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_470,"file");
  pcVar8 = archive_entry_pathname(local_470);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'Ô',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_470,0x81ed);
  mVar3 = archive_entry_mode(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ö',0x81ed,"S_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(local_470,0x81000);
  archive_entry_sparse_add_entry(local_470,0x10000,0x1000);
  archive_entry_sparse_add_entry(local_470,0x80000,0x1000);
  iVar2 = archive_write_header(paVar5,local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar5);
  archive_entry_free(local_470);
  memset(__s,0x61,0x11000);
  lVar9 = archive_write_data(paVar5,__s,0x11000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ß',0x11000,"buff2_size",lVar9,"archive_write_data(a, buff2, buff2_size)",
                      (void *)0x0);
  iVar2 = archive_write_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'â',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar5);
  iVar2 = archive_write_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ã',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  failure("blocksize=%zu",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'è',0x5000,"((11264 - 1)/blocksize+1)*blocksize",local_458,"used",
                      (void *)0x0);
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                   ,L'í',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'î',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar5)
  ;
  iVar2 = archive_read_support_filter_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ï',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar5)
  ;
  iVar2 = archive_read_open_memory(paVar5,buff,local_458);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ð',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar5);
  iVar2 = archive_read_next_header(paVar5,&local_470);
  local_468 = paVar5;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ò',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
  tVar6 = archive_entry_mtime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ô',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  lVar7 = archive_entry_mtime_nsec(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'õ',10,"10",lVar7,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar6 = archive_entry_atime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ö',0,"0",tVar6,"archive_entry_atime(ae)",(void *)0x0);
  tVar6 = archive_entry_ctime(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'÷',0,"0",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar8 = archive_entry_pathname(local_470);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
             ,L'ø',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ù',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  mVar3 = archive_entry_mode(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ú',0x81ed,"AE_IFREG | 0755",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  lVar10 = archive_entry_size(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'û',0x81000,"0x81000",lVar10,"archive_entry_size(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_reset(local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ý',2,"2",(long)wVar4,"archive_entry_sparse_reset(ae)",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'þ',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ÿ',0x10000,"0x10000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ā',0x1000,"0x1000",local_450,"length",(void *)0x0);
  wVar4 = archive_entry_sparse_next(local_470,&local_448,&local_450);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ā',0,"0",(long)wVar4,"archive_entry_sparse_next(ae, &offset, &length)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ă',0x80000,"0x80000",local_448,"offset",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ă',0x1000,"0x1000",local_450,"length",(void *)0x0);
  memset(local_438,0,0x400);
  uVar11 = 0;
  do {
    lVar9 = archive_read_data(local_468,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ć',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar11,uVar11 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ċ',__s,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar12 = uVar11 < 0xfc00;
    uVar11 = uVar11 + 0x400;
  } while (bVar12);
  memset(local_438,0x61,0x400);
  uVar11 = 0x10000;
  do {
    lVar9 = archive_read_data(local_468,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ď',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar11,uVar11 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'đ',__s,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar12 = uVar11 < 0x10c00;
    uVar11 = uVar11 + 0x400;
  } while (bVar12);
  memset(local_438,0,0x400);
  uVar11 = 0x11000;
  do {
    lVar9 = archive_read_data(local_468,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ĕ',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all zero",uVar11,uVar11 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ę',__s,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    bVar12 = uVar11 < 0x7fc00;
    uVar11 = uVar11 + 0x400;
  } while (bVar12);
  memset(local_438,0,0x400);
  uVar11 = 0x80000;
  do {
    lVar9 = archive_read_data(local_468,__s,0x400);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'Ĝ',0x400,"1024",lVar9,"archive_read_data(a, buff2, 1024)",(void *)0x0);
    failure("Read data(0x%lx - 0x%lx) should be all \'a\'",uVar11,uVar11 + 0x400);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                        ,L'ğ',__s,"buff2",local_438,"buff3",0x400,"1024",(void *)0x0);
    paVar5 = local_468;
    bVar12 = uVar11 < 0x80c00;
    uVar11 = uVar11 + 0x400;
  } while (bVar12);
  iVar2 = archive_read_next_header(local_468,&local_470);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ĥ',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar5);
  iVar2 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'ĥ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar5);
  iVar2 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_tar_sparse.c"
                      ,L'Ħ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  free(__s);
  return;
}

Assistant:

static void
test_1(void)
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t blocksize;
	int64_t offset, length;
	char *buff2;
	size_t buff2_size = 0x13000;
	char buff3[1024];
	unsigned long i;

	assert((buff2 = malloc(buff2_size)) != NULL);
	/* Repeat the following for a variety of odd blocksizes. */
	for (blocksize = 1; blocksize < 100000; blocksize += blocksize + 3) {
		/* Create a new archive in memory. */
		assert((a = archive_write_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_format_pax(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_add_filter_none(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_per_block(a, (int)blocksize));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_set_bytes_in_last_block(a, (int)blocksize));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_write_open_memory(a, buff, sizeof(buff), &used));
		assertEqualInt(blocksize,
		    archive_write_get_bytes_in_last_block(a));

		/*
		 * Write a file to it.
		 */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_mtime(ae, 1, 10);
		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		archive_entry_copy_pathname(ae, "file");
		assertEqualString("file", archive_entry_pathname(ae));
		archive_entry_set_mode(ae, S_IFREG | 0755);
		assertEqualInt(S_IFREG | 0755, archive_entry_mode(ae));
		archive_entry_set_size(ae, 0x81000);
		archive_entry_sparse_add_entry(ae, 0x10000, 0x1000);
		archive_entry_sparse_add_entry(ae, 0x80000, 0x1000);

		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		archive_entry_free(ae);
		memset(buff2, 'a', buff2_size);
		for (i = 0; i < 0x81000;) {
			size_t ws = buff2_size;
			if (i + ws > 0x81000)
				ws = 0x81000 - i;
			assertEqualInt(ws,
				archive_write_data(a, buff2, ws));
			i += (long)ws;
		}

		/* Close out the archive. */
		assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));

		/* This calculation gives "the smallest multiple of
		 * the block size that is at least 11264 bytes". */
		failure("blocksize=%zu", blocksize);
		assertEqualInt(((11264 - 1)/blocksize+1)*blocksize, used);

		/*
		 * Now, read the data back.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used));

		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header(a, &ae));

		assertEqualInt(1, archive_entry_mtime(ae));
		assertEqualInt(10, archive_entry_mtime_nsec(ae));
		assertEqualInt(0, archive_entry_atime(ae));
		assertEqualInt(0, archive_entry_ctime(ae));
		assertEqualString("file", archive_entry_pathname(ae));
		assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
		assertEqualInt(AE_IFREG | 0755, archive_entry_mode(ae));
		assertEqualInt(0x81000, archive_entry_size(ae));
		/* Verify sparse information. */
		assertEqualInt(2, archive_entry_sparse_reset(ae));
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x10000, offset);
		assertEqualInt(0x1000, length);
		assertEqualInt(0,
			archive_entry_sparse_next(ae, &offset, &length));
		assertEqualInt(0x80000, offset);
		assertEqualInt(0x1000, length);
		/* Verify file contents. */
		memset(buff3, 0, sizeof(buff3));
		for (i = 0; i < 0x10000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x10000; i < 0x11000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 0, sizeof(buff3));
		for (i = 0x11000; i < 0x80000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all zero",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}
		memset(buff3, 'a', sizeof(buff3));
		for (i = 0x80000; i < 0x81000; i += 1024) {
			assertEqualInt(1024, archive_read_data(a, buff2, 1024));
			failure("Read data(0x%lx - 0x%lx) should be all 'a'",
			    i, i + 1024);
			assertEqualMem(buff2, buff3, 1024);
		}

		/* Verify the end of the archive. */
		assertEqualIntA(a, ARCHIVE_EOF,
		    archive_read_next_header(a, &ae));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
	free(buff2);
}